

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_XsimInv(int Value)

{
  if (Value - 1U < 3) {
    return *(int *)(&DAT_006b4360 + (ulong)(Value - 1U) * 4);
  }
  __assert_fail("Value == AU_VALX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieNew.c"
                ,0x4f2,"int Au_XsimInv(int)");
}

Assistant:

static inline int  Au_XsimInv( int Value )   
{ 
    if ( Value == AU_VAL0 )
        return AU_VAL1;
    if ( Value == AU_VAL1 )
        return AU_VAL0;
    assert( Value == AU_VALX );       
    return AU_VALX;
}